

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

double gmath::transformGaussJordan(Matrixd *a)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  DMatrix<double> *in_RDI;
  DMatrix<double> *pDVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  int i_3;
  double v_2;
  int k_2;
  int i_2;
  double s;
  double v_1;
  int i_1;
  int k_1;
  int pivot;
  int j;
  int n;
  int i;
  double v;
  int k;
  double eps;
  double ret;
  int local_74;
  int local_68;
  int local_64;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  double local_28;
  int local_1c;
  double local_18;
  double local_10;
  DMatrix<double> *local_8;
  
  local_10 = 1.0;
  local_18 = 0.0;
  local_8 = in_RDI;
  for (local_1c = 0; iVar3 = local_1c, iVar2 = DMatrix<double>::rows(local_8), iVar3 < iVar2;
      local_1c = local_1c + 1) {
    local_28 = 0.0;
    for (local_2c = 0; iVar3 = local_2c, iVar2 = DMatrix<double>::cols(local_8), iVar3 < iVar2;
        local_2c = local_2c + 1) {
      pDVar6 = local_8;
      DMatrix<double>::operator()(local_8,local_1c,local_2c);
      std::abs((int)pDVar6);
      local_28 = extraout_XMM0_Qa + local_28;
    }
    pdVar4 = std::max<double>(&local_18,&local_28);
    local_18 = *pdVar4;
  }
  local_34 = DMatrix<double>::rows(local_8);
  local_38 = DMatrix<double>::cols(local_8);
  piVar5 = std::max<int>(&local_34,&local_38);
  local_30 = *piVar5;
  local_18 = (double)local_30 * local_18;
  dVar7 = pow(2.0,-52.0);
  local_18 = dVar7 * local_18;
  local_3c = DMatrix<double>::rows(local_8);
  local_40 = DMatrix<double>::cols(local_8);
  piVar5 = std::min<int>(&local_3c,&local_40);
  local_30 = *piVar5;
  local_44 = 0;
  while( true ) {
    if (local_30 <= local_44) {
      return local_10;
    }
    local_48 = local_44;
    local_4c = local_44;
    while( true ) {
      local_4c = local_4c + 1;
      iVar3 = DMatrix<double>::rows(local_8);
      if (iVar3 <= local_4c) break;
      pDVar6 = local_8;
      DMatrix<double>::operator()(local_8,local_4c,local_44);
      std::abs((int)pDVar6);
      pDVar6 = local_8;
      DMatrix<double>::operator()(local_8,local_48,local_44);
      std::abs((int)pDVar6);
      if (extraout_XMM0_Qa_01 < extraout_XMM0_Qa_00) {
        local_48 = local_4c;
      }
    }
    pDVar6 = local_8;
    DMatrix<double>::operator()(local_8,local_48,local_44);
    std::abs((int)pDVar6);
    if (extraout_XMM0_Qa_02 < local_18) break;
    if (local_48 != local_44) {
      for (local_50 = local_44; iVar3 = DMatrix<double>::cols(local_8), local_50 < iVar3;
          local_50 = local_50 + 1) {
        pdVar4 = DMatrix<double>::operator()(local_8,local_44,local_50);
        dVar7 = *pdVar4;
        pdVar4 = DMatrix<double>::operator()(local_8,local_48,local_50);
        dVar1 = *pdVar4;
        pdVar4 = DMatrix<double>::operator()(local_8,local_44,local_50);
        *pdVar4 = dVar1;
        pdVar4 = DMatrix<double>::operator()(local_8,local_48,local_50);
        *pdVar4 = dVar7;
      }
      local_10 = local_10 * -1.0;
    }
    pdVar4 = DMatrix<double>::operator()(local_8,local_44,local_44);
    dVar7 = *pdVar4;
    for (local_64 = local_44; iVar3 = DMatrix<double>::cols(local_8), local_64 < iVar3;
        local_64 = local_64 + 1) {
      pdVar4 = DMatrix<double>::operator()(local_8,local_44,local_64);
      *pdVar4 = *pdVar4 / dVar7;
    }
    local_10 = dVar7 * local_10;
    for (local_68 = 0; iVar3 = DMatrix<double>::rows(local_8), local_68 < iVar3;
        local_68 = local_68 + 1) {
      if (local_68 != local_44) {
        pdVar4 = DMatrix<double>::operator()(local_8,local_68,local_44);
        dVar7 = *pdVar4;
        for (local_74 = local_44; iVar3 = DMatrix<double>::cols(local_8), local_74 < iVar3;
            local_74 = local_74 + 1) {
          pdVar4 = DMatrix<double>::operator()(local_8,local_44,local_74);
          dVar1 = *pdVar4;
          pdVar4 = DMatrix<double>::operator()(local_8,local_68,local_74);
          *pdVar4 = -dVar7 * dVar1 + *pdVar4;
        }
      }
    }
    local_44 = local_44 + 1;
  }
  return 0.0;
}

Assistant:

double transformGaussJordan(Matrixd &a)
{
  double ret=1;

  // compute a meaningful epsilon

  double eps=0;

  for (int k=0; k<a.rows(); k++)
  {
    double v=0;

    for (int i=0; i<a.cols(); i++)
    {
      v+=std::abs(a(k, i));
    }

    eps=std::max(eps, v);
  }

  int n=std::max(a.rows(), a.cols());

  eps*=n;
  eps*=pow(2, -52);

  // for all rows

  n=std::min(a.rows(), a.cols());

  for (int j=0; j<n; j++)
  {
    // find pivot element

    int pivot=j;

    for (int k=j+1; k<a.rows(); k++)
    {
      if (std::abs(a(k, j)) > std::abs(a(pivot, j)))
      {
        pivot=k;
      }
    }

    // stop, if pivot element is 0

    if (std::abs(a(pivot, j)) < eps)
    {
      ret=0;
      break;
    }

    // interchange line j with line with pivot element

    if (pivot != j)
    {
      for (int i=j; i<a.cols(); i++)
      {
        double v=a(j, i);
        a(j, i)=a(pivot, i);
        a(pivot, i)=v;
      }

      ret*=-1;
    }

    pivot=j;

    // scale pivot line such that the pivot element becomes 1

    double s=a(pivot, pivot);

    for (int i=pivot; i<a.cols(); i++)
    {
      a(pivot, i)/=s;
    }

    ret*=s;

    // eliminate all elements of the pivot column except the pivot
    // element

    for (int k=0; k<a.rows(); k++)
    {
      if (k != pivot)
      {
        double v=a(k, pivot);

        for (int i=pivot; i<a.cols(); i++)
        {
          a(k, i)-=v*a(pivot, i);
        }
      }
    }
  }

  return ret;
}